

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::hufBuildDecTable(longlong *hcode,int im,int iM,HufDec *hdecod)

{
  bool bVar1;
  int *piVar2;
  int *piVar3;
  sbyte sVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  HufDec *pHVar8;
  long lVar9;
  int iVar10;
  int *p;
  
  bVar1 = true;
  if (im <= iM) {
    bVar1 = false;
    lVar9 = (long)im;
    do {
      uVar6 = hcode[lVar9];
      lVar7 = (long)uVar6 >> 6;
      uVar5 = (uint)uVar6 & 0x3f;
      sVar4 = (sbyte)uVar5;
      if (lVar7 >> sVar4 != 0) {
        return bVar1;
      }
      if (uVar5 < 0xf) {
        if ((uVar6 & 0x3f) != 0) {
          pHVar8 = hdecod + (lVar7 << (0xeU - sVar4 & 0x3f));
          lVar7 = (1L << (0xeU - sVar4 & 0x3f)) + 1;
          do {
            if (*(char *)pHVar8 != '\0') {
              return bVar1;
            }
            if (pHVar8->p != (int *)0x0) {
              return bVar1;
            }
            *(uint *)pHVar8 = (int)lVar9 << 8 | uVar5;
            pHVar8 = pHVar8 + 1;
            lVar7 = lVar7 + -1;
          } while (1 < lVar7);
        }
      }
      else {
        lVar7 = lVar7 >> (sVar4 - 0xeU & 0x3f);
        if ((char)*(int *)(hdecod + lVar7) != '\0') {
          return bVar1;
        }
        pHVar8 = hdecod + lVar7;
        iVar10 = *(int *)(hdecod + lVar7) + 0x100;
        *(int *)pHVar8 = iVar10;
        piVar3 = pHVar8->p;
        if (piVar3 == (int *)0x0) {
          piVar3 = (int *)operator_new__(4);
          pHVar8->p = piVar3;
        }
        else {
          iVar10 = iVar10 >> 8;
          uVar6 = (long)iVar10 * 4;
          if (iVar10 < 0) {
            uVar6 = 0xffffffffffffffff;
          }
          piVar2 = (int *)operator_new__(uVar6);
          pHVar8->p = piVar2;
          if (1 < iVar10) {
            uVar6 = 0;
            do {
              piVar2[uVar6] = piVar3[uVar6];
              uVar6 = uVar6 + 1;
            } while (iVar10 - 1 != uVar6);
          }
          operator_delete__(piVar3);
          piVar3 = pHVar8->p;
          iVar10 = *(int *)pHVar8;
        }
        piVar3[(long)(iVar10 >> 8) + -1] = (int)lVar9;
      }
      lVar7 = lVar9 + 1;
      bVar1 = iM <= lVar9;
      lVar9 = lVar7;
    } while (iM + 1 != (int)lVar7);
  }
  return bVar1;
}

Assistant:

bool hufBuildDecTable(const long long *hcode,  // i : encoding table
                      int im,                  // i : min index in hcode
                      int iM,                  // i : max index in hcode
                      HufDec *hdecod)          //  o: (allocated by caller)
//     decoding table [HUF_DECSIZE]
{
  //
  // Init hashtable & loop on all codes.
  // Assumes that hufClearDecTable(hdecod) has already been called.
  //

  for (; im <= iM; im++) {
    long long c = hufCode(hcode[im]);
    int l = hufLength(hcode[im]);

    if (c >> l) {
      //
      // Error: c is supposed to be an l-bit code,
      // but c contains a value that is greater
      // than the largest l-bit number.
      //

      // invalidTableEntry();
      return false;
    }

    if (l > HUF_DECBITS) {
      //
      // Long code: add a secondary entry
      //

      HufDec *pl = hdecod + (c >> (l - HUF_DECBITS));

      if (pl->len) {
        //
        // Error: a short code has already
        // been stored in table entry *pl.
        //

        // invalidTableEntry();
        return false;
      }

      pl->lit++;

      if (pl->p) {
        int *p = pl->p;
        pl->p = new int[pl->lit];

        for (int i = 0; i < pl->lit - 1; ++i) pl->p[i] = p[i];

        delete[] p;
      } else {
        pl->p = new int[1];
      }

      pl->p[pl->lit - 1] = im;
    } else if (l) {
      //
      // Short code: init all primary entries
      //

      HufDec *pl = hdecod + (c << (HUF_DECBITS - l));

      for (long long i = 1ULL << (HUF_DECBITS - l); i > 0; i--, pl++) {
        if (pl->len || pl->p) {
          //
          // Error: a short code or a long code has
          // already been stored in table entry *pl.
          //

          // invalidTableEntry();
          return false;
        }

        pl->len = l;
        pl->lit = im;
      }
    }
  }

  return true;
}